

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetriang.cpp
# Opt level: O2

void pzshape::TPZShapeTriang::ShapeGenerating
               (TPZVec<double> *pt,TPZVec<int> *nshape,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  long row;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double *pdVar10;
  ulong uVar11;
  long row_00;
  long row_01;
  
  uVar11 = 4;
  row_00 = 0;
  while( true ) {
    if (row_00 == 3) break;
    if (0 < nshape->fStore[row_00]) {
      row = row_00 + 3;
      dVar1 = (double)(&DAT_0130a718)[row_00];
      pdVar10 = TPZFMatrix<double>::operator()(phi,row_00,0);
      dVar2 = *pdVar10;
      row_01 = (uVar11 / 3) * -3 + 4 + row_00;
      pdVar10 = TPZFMatrix<double>::operator()(phi,row_01,0);
      dVar3 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()(phi,row,0);
      *pdVar10 = dVar2 * dVar1 * dVar3;
      pdVar10 = TPZFMatrix<double>::operator()(dphi,0,row_00);
      dVar2 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()(phi,row_01,0);
      dVar3 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()(phi,row_00,0);
      dVar4 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()(dphi,0,row_01);
      dVar5 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()(dphi,0,row);
      *pdVar10 = (dVar4 * dVar5 + dVar2 * dVar3) * dVar1;
      pdVar10 = TPZFMatrix<double>::operator()(dphi,1,row_00);
      dVar2 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()(phi,row_01,0);
      dVar3 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()(phi,row_00,0);
      dVar4 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()(dphi,1,row_01);
      dVar5 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()(dphi,1,row);
      *pdVar10 = (dVar4 * dVar5 + dVar2 * dVar3) * dVar1;
    }
    row_00 = row_00 + 1;
    uVar11 = uVar11 + 1;
  }
  pdVar10 = TPZFMatrix<double>::operator()(phi,0,0);
  dVar1 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(phi,1,0);
  dVar2 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(phi,2,0);
  dVar3 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(phi,6,0);
  *pdVar10 = dVar1 * 27.0 * dVar2 * dVar3;
  pdVar10 = TPZFMatrix<double>::operator()(dphi,0,0);
  dVar1 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(phi,1,0);
  dVar2 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(phi,2,0);
  dVar3 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(phi,0,0);
  dVar4 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(dphi,0,1);
  dVar5 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(phi,2,0);
  dVar6 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(phi,0,0);
  dVar7 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(phi,1,0);
  dVar8 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(dphi,0,2);
  dVar9 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(dphi,0,6);
  *pdVar10 = (dVar7 * dVar8 * dVar9 + dVar4 * dVar5 * dVar6 + dVar1 * dVar2 * dVar3) * 27.0;
  pdVar10 = TPZFMatrix<double>::operator()(dphi,1,0);
  dVar1 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(phi,1,0);
  dVar2 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(phi,2,0);
  dVar3 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(phi,0,0);
  dVar4 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(dphi,1,1);
  dVar5 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(phi,2,0);
  dVar6 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(phi,0,0);
  dVar7 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(phi,1,0);
  dVar8 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(dphi,1,2);
  dVar9 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(dphi,1,6);
  *pdVar10 = (dVar7 * dVar8 * dVar9 + dVar4 * dVar5 * dVar6 + dVar1 * dVar2 * dVar3) * 27.0;
  return;
}

Assistant:

void TPZShapeTriang::ShapeGenerating(const TPZVec<REAL> &pt, TPZVec<int> &nshape, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
    {
        // Make the generating shape functions linear and unitary
        REAL mult[] = {1.,1.,1.,4.,4.,4.,27.};
        int is;
        for(is=3; is<6; is++)
        {
            if(nshape[is-NCornerNodes] < 1) continue;
            int is1 = is%3;
            int is2 = (is+1)%3;
            phi(is,0) = mult[is]*phi(is1,0)*phi(is2,0);
            dphi(0,is) = mult[is]*(dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2));
            dphi(1,is) = mult[is]*(dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2));
        }
        int is1 = 0;
        int is2 = 1;
        int is3 = 2;
        phi(is,0) = mult[6]*phi(is1,0)*phi(is2,0)*phi(is3,0);
        dphi(0,is) = mult[6]*( dphi(0,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(0,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(0,is3));
        dphi(1,is) = mult[6]*( dphi(1,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(1,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(1,is3));
        
    }